

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void * encode_bmp_to_jpegls
                 (void *pixel_data,size_t stride,bmp_dib_header_t *header,
                 charls_interleave_mode interleave_mode,int near_lossless,size_t *bytes_written)

{
  size_t __size;
  uint8_t *planar_buffer;
  void *pvVar1;
  size_t pixel_data_size_1;
  void *planar_pixel_data;
  size_t pixel_data_size;
  void *encoded_buffer;
  size_t encoded_buffer_size;
  undefined1 auStack_50 [4];
  charls_jpegls_errc error;
  charls_frame_info frame_info;
  charls_jpegls_encoder *encoder;
  size_t *bytes_written_local;
  int near_lossless_local;
  charls_interleave_mode interleave_mode_local;
  bmp_dib_header_t *header_local;
  size_t stride_local;
  void *pixel_data_local;
  
  if (header->depth != 0x18) {
    __assert_fail("header->depth == 24 && \"This function only supports 24-bit BMP pixel data.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.c/main.c"
                  ,0xbd,
                  "void *encode_bmp_to_jpegls(const void *, const size_t, const bmp_dib_header_t *, const charls_interleave_mode, const int, size_t *)"
                 );
  }
  if (header->compress_type != 0) {
    __assert_fail("header->compress_type == 0 && \"Data needs to be stored by pixel as RGB.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.c/main.c"
                  ,0xbe,
                  "void *encode_bmp_to_jpegls(const void *, const size_t, const bmp_dib_header_t *, const charls_interleave_mode, const int, size_t *)"
                 );
  }
  if (header->width == 0) {
    __assert_fail("header->width > 0 && \"0 width not supported, may cause 0 byte malloc\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.c/main.c"
                  ,0xbf,
                  "void *encode_bmp_to_jpegls(const void *, const size_t, const bmp_dib_header_t *, const charls_interleave_mode, const int, size_t *)"
                 );
  }
  if (0 < header->height) {
    frame_info._8_8_ = charls_jpegls_encoder_create();
    if ((charls_jpegls_encoder *)frame_info._8_8_ == (charls_jpegls_encoder *)0x0) {
      printf("Failed to create JPEG-LS encoder\n");
      pixel_data_local = (void *)0x0;
    }
    else {
      frame_info.width = 8;
      frame_info.height = 3;
      auStack_50 = header->width;
      unique0x100002c9 = header->height;
      encoded_buffer_size._4_4_ =
           charls_jpegls_encoder_set_frame_info
                     ((charls_jpegls_encoder *)frame_info._8_8_,(charls_frame_info *)auStack_50);
      if (encoded_buffer_size._4_4_ == CHARLS_JPEGLS_ERRC_SUCCESS) {
        encoded_buffer_size._4_4_ =
             charls_jpegls_encoder_set_interleave_mode
                       ((charls_jpegls_encoder *)frame_info._8_8_,interleave_mode);
        if (encoded_buffer_size._4_4_ == CHARLS_JPEGLS_ERRC_SUCCESS) {
          encoded_buffer_size._4_4_ =
               charls_jpegls_encoder_set_near_lossless
                         ((charls_jpegls_encoder *)frame_info._8_8_,near_lossless);
          if (encoded_buffer_size._4_4_ == CHARLS_JPEGLS_ERRC_SUCCESS) {
            encoded_buffer_size._4_4_ =
                 charls_jpegls_encoder_get_estimated_destination_size
                           ((charls_jpegls_encoder *)frame_info._8_8_,(size_t *)&encoded_buffer);
            if (encoded_buffer_size._4_4_ == CHARLS_JPEGLS_ERRC_SUCCESS) {
              pixel_data_local = malloc((size_t)encoded_buffer);
              if (pixel_data_local == (void *)0x0) {
                pixel_data_local =
                     handle_encoder_failure
                               (encoded_buffer_size._4_4_,"malloc failed",
                                (charls_jpegls_encoder *)frame_info._8_8_,(void *)0x0);
              }
              else {
                encoded_buffer_size._4_4_ =
                     charls_jpegls_encoder_set_destination_buffer
                               ((charls_jpegls_encoder *)frame_info._8_8_,pixel_data_local,
                                (size_t)encoded_buffer);
                if (encoded_buffer_size._4_4_ == CHARLS_JPEGLS_ERRC_SUCCESS) {
                  if ((header->vertical_resolution < 100) || (header->horizontal_resolution < 100))
                  {
                    encoded_buffer_size._4_4_ =
                         charls_jpegls_encoder_write_standard_spiff_header
                                   ((charls_jpegls_encoder *)frame_info._8_8_,rgb,aspect_ratio,1,1);
                  }
                  else {
                    encoded_buffer_size._4_4_ =
                         charls_jpegls_encoder_write_standard_spiff_header
                                   ((charls_jpegls_encoder *)frame_info._8_8_,rgb,
                                    dots_per_centimeter,header->vertical_resolution / 100,
                                    header->horizontal_resolution / 100);
                  }
                  if (encoded_buffer_size._4_4_ == CHARLS_JPEGLS_ERRC_SUCCESS) {
                    if (interleave_mode == CHARLS_INTERLEAVE_MODE_NONE) {
                      __size = (long)header->height * (ulong)header->width * 3;
                      planar_buffer = (uint8_t *)malloc(__size);
                      if (planar_buffer == (uint8_t *)0x0) {
                        pvVar1 = handle_encoder_failure
                                           (CHARLS_JPEGLS_ERRC_NOT_ENOUGH_MEMORY,"malloc",
                                            (charls_jpegls_encoder *)frame_info._8_8_,
                                            pixel_data_local);
                        return pvVar1;
                      }
                      triplet_to_planar((uint8_t *)pixel_data,planar_buffer,(ulong)header->width,
                                        (long)header->height,stride);
                      encoded_buffer_size._4_4_ =
                           charls_jpegls_encoder_encode_from_buffer
                                     ((charls_jpegls_encoder *)frame_info._8_8_,planar_buffer,__size
                                      ,0);
                      free(planar_buffer);
                    }
                    else {
                      encoded_buffer_size._4_4_ =
                           charls_jpegls_encoder_encode_from_buffer
                                     ((charls_jpegls_encoder *)frame_info._8_8_,pixel_data,
                                      (long)header->height * stride,(uint32_t)stride);
                    }
                    if (encoded_buffer_size._4_4_ == CHARLS_JPEGLS_ERRC_SUCCESS) {
                      encoded_buffer_size._4_4_ =
                           charls_jpegls_encoder_get_bytes_written
                                     ((charls_jpegls_encoder *)frame_info._8_8_,bytes_written);
                      if (encoded_buffer_size._4_4_ == CHARLS_JPEGLS_ERRC_SUCCESS) {
                        charls_jpegls_encoder_destroy((charls_jpegls_encoder *)frame_info._8_8_);
                      }
                      else {
                        pixel_data_local =
                             handle_encoder_failure
                                       (encoded_buffer_size._4_4_,"get bytes written",
                                        (charls_jpegls_encoder *)frame_info._8_8_,pixel_data_local);
                      }
                    }
                    else {
                      pixel_data_local =
                           handle_encoder_failure
                                     (encoded_buffer_size._4_4_,"encode",
                                      (charls_jpegls_encoder *)frame_info._8_8_,pixel_data_local);
                    }
                  }
                  else {
                    pixel_data_local =
                         handle_encoder_failure
                                   (encoded_buffer_size._4_4_,"write_standard_spiff_header",
                                    (charls_jpegls_encoder *)frame_info._8_8_,pixel_data_local);
                  }
                }
                else {
                  pixel_data_local =
                       handle_encoder_failure
                                 (encoded_buffer_size._4_4_,"set destination buffer",
                                  (charls_jpegls_encoder *)frame_info._8_8_,pixel_data_local);
                }
              }
            }
            else {
              pixel_data_local =
                   handle_encoder_failure
                             (encoded_buffer_size._4_4_,"get estimated destination size",
                              (charls_jpegls_encoder *)frame_info._8_8_,(void *)0x0);
            }
          }
          else {
            pixel_data_local =
                 handle_encoder_failure
                           (encoded_buffer_size._4_4_,"set near lossless",
                            (charls_jpegls_encoder *)frame_info._8_8_,(void *)0x0);
          }
        }
        else {
          pixel_data_local =
               handle_encoder_failure
                         (encoded_buffer_size._4_4_,"set near interleave mode",
                          (charls_jpegls_encoder *)frame_info._8_8_,(void *)0x0);
        }
      }
      else {
        pixel_data_local =
             handle_encoder_failure
                       (encoded_buffer_size._4_4_,"set frame_info",
                        (charls_jpegls_encoder *)frame_info._8_8_,(void *)0x0);
      }
    }
    return pixel_data_local;
  }
  __assert_fail("header->height > 0 && \"0 and negative height not supported, may cause 0 byte malloc\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.c/main.c"
                ,0xc0,
                "void *encode_bmp_to_jpegls(const void *, const size_t, const bmp_dib_header_t *, const charls_interleave_mode, const int, size_t *)"
               );
}

Assistant:

static void* encode_bmp_to_jpegls(const void* pixel_data, const size_t stride, const bmp_dib_header_t* header,
                                  const charls_interleave_mode interleave_mode, const int near_lossless,
                                  size_t* bytes_written)
{
    assert(header->depth == 24 && "This function only supports 24-bit BMP pixel data.");
    assert(header->compress_type == 0 && "Data needs to be stored by pixel as RGB.");
    assert(header->width > 0 && "0 width not supported, may cause 0 byte malloc");
    assert(header->height > 0 && "0 and negative height not supported, may cause 0 byte malloc");

    charls_jpegls_encoder* encoder = charls_jpegls_encoder_create();
    if (!encoder)
    {
        printf("Failed to create JPEG-LS encoder\n");
        return NULL;
    }

    charls_frame_info frame_info = {.bits_per_sample = 8, .component_count = 3};
    frame_info.width = header->width;
    frame_info.height = (uint32_t)header->height;
    charls_jpegls_errc error = charls_jpegls_encoder_set_frame_info(encoder, &frame_info);
    if (error)
    {
        return handle_encoder_failure(error, "set frame_info", encoder, NULL);
    }

    error = charls_jpegls_encoder_set_interleave_mode(encoder, interleave_mode);
    if (error)
    {
        return handle_encoder_failure(error, "set near interleave mode", encoder, NULL);
    }

    error = charls_jpegls_encoder_set_near_lossless(encoder, near_lossless);
    if (error)
    {
        return handle_encoder_failure(error, "set near lossless", encoder, NULL);
    }

    size_t encoded_buffer_size;
    error = charls_jpegls_encoder_get_estimated_destination_size(encoder, &encoded_buffer_size);
    if (error)
    {
        return handle_encoder_failure(error, "get estimated destination size", encoder, NULL);
    }

    void* encoded_buffer = malloc(encoded_buffer_size);
    if (!encoded_buffer)
    {
        return handle_encoder_failure(error, "malloc failed", encoder, NULL);
    }

    error = charls_jpegls_encoder_set_destination_buffer(encoder, encoded_buffer, encoded_buffer_size);
    if (error)
    {
        return handle_encoder_failure(error, "set destination buffer", encoder, encoded_buffer);
    }

    // The resolution in BMP files is often 0 to indicate that no resolution has been defined.
    // The SPIFF header specification requires however that VRES and HRES are never 0.
    // The ISO 10918-3 recommendation for these cases is to define that the pixels should be interpreted as a square.
    if (header->vertical_resolution < 100 || header->horizontal_resolution < 100)
    {
        error = charls_jpegls_encoder_write_standard_spiff_header(encoder, CHARLS_SPIFF_COLOR_SPACE_RGB,
                                                                  CHARLS_SPIFF_RESOLUTION_UNITS_ASPECT_RATIO, 1, 1);
    }
    else
    {
        error = charls_jpegls_encoder_write_standard_spiff_header(
            encoder, CHARLS_SPIFF_COLOR_SPACE_RGB, CHARLS_SPIFF_RESOLUTION_UNITS_DOTS_PER_CENTIMETER,
            header->vertical_resolution / 100, header->horizontal_resolution / 100);
    }

    if (error)
    {
        return handle_encoder_failure(error, "write_standard_spiff_header", encoder, encoded_buffer);
    }

    if (interleave_mode == CHARLS_INTERLEAVE_MODE_NONE)
    {
        const size_t pixel_data_size = (size_t)header->height * header->width * bytes_per_rgb_pixel;
        void* planar_pixel_data = malloc(pixel_data_size);
        if (!planar_pixel_data)
        {
            return handle_encoder_failure(CHARLS_JPEGLS_ERRC_NOT_ENOUGH_MEMORY, "malloc", encoder, encoded_buffer);
        }

        triplet_to_planar(pixel_data, planar_pixel_data, header->width, (size_t)header->height, stride);
        error = charls_jpegls_encoder_encode_from_buffer(encoder, planar_pixel_data, pixel_data_size, 0);
        free(planar_pixel_data);
    }
    else
    {
        const size_t pixel_data_size = (size_t)header->height * stride;
        error = charls_jpegls_encoder_encode_from_buffer(encoder, pixel_data, pixel_data_size, (uint32_t)stride);
    }

    if (error)
    {
        return handle_encoder_failure(error, "encode", encoder, encoded_buffer);
    }

    error = charls_jpegls_encoder_get_bytes_written(encoder, bytes_written);
    if (error)
    {
        return handle_encoder_failure(error, "get bytes written", encoder, encoded_buffer);
    }

    charls_jpegls_encoder_destroy(encoder);

    return encoded_buffer;
}